

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O2

int Vec_QuePop(Vec_Que_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  float *pfVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  if (p->nSize < 2) {
    __assert_fail("p->nSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                  ,0xed,"int Vec_QuePop(Vec_Que_t *)");
  }
  piVar4 = p->pHeap;
  piVar5 = p->pOrder;
  iVar1 = piVar4[1];
  piVar5[iVar1] = -1;
  iVar2 = p->nSize;
  p->nSize = iVar2 + -1;
  if (iVar2 + -1 == 1) {
    piVar4[1] = -1;
  }
  else {
    iVar3 = piVar4[(long)iVar2 + -1];
    piVar4[(long)iVar2 + -1] = -1;
    piVar4[1] = iVar3;
    piVar5[iVar3] = 1;
    pfVar6 = *p->pCostsFlt;
    if (pfVar6 == (float *)0x0) {
      fVar10 = (float)iVar3;
    }
    else {
      fVar10 = pfVar6[iVar3];
    }
    uVar8 = 1;
    while( true ) {
      uVar9 = uVar8 * 2;
      iVar2 = p->nSize;
      if (iVar2 <= (int)uVar9) break;
      uVar7 = uVar9 | 1;
      if ((int)uVar7 < iVar2) {
        if (pfVar6 == (float *)0x0) {
          fVar11 = (float)piVar4[(int)uVar9];
          fVar12 = (float)piVar4[(int)uVar7];
        }
        else {
          fVar11 = pfVar6[piVar4[(int)uVar9]];
          fVar12 = pfVar6[piVar4[(int)uVar7]];
        }
        if (fVar11 < fVar12) {
          uVar9 = uVar7;
        }
      }
      if (iVar2 <= (int)uVar9) {
        __assert_fail("child < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                      ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
      }
      iVar2 = piVar4[(int)uVar9];
      if (pfVar6 == (float *)0x0) {
        fVar11 = (float)iVar2;
      }
      else {
        fVar11 = pfVar6[iVar2];
      }
      if (fVar11 <= fVar10) break;
      piVar4[(int)uVar8] = iVar2;
      piVar5[iVar2] = uVar8;
      uVar8 = uVar9;
    }
    piVar4[(int)uVar8] = iVar3;
    piVar5[iVar3] = uVar8;
  }
  return iVar1;
}

Assistant:

static inline int Vec_QuePop( Vec_Que_t * p )
{
    int v, Res;
    assert( p->nSize > 1 );
    Res = p->pHeap[1];      p->pOrder[Res] = -1;
    if ( --p->nSize == 1 )
    {
        p->pHeap[1] = -1;
        return Res;
    }
    v = p->pHeap[p->nSize]; p->pHeap[p->nSize] = -1;
    p->pHeap[1] = v;        p->pOrder[v] = 1;
    Vec_QueMoveDown( p, v );
    return Res;
}